

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O0

int_fast16_t flexfloat_exp(flexfloat_t *a)

{
  int_fast16_t iVar1;
  ulong *in_RDI;
  int_fast16_t bias;
  int_fast16_t a_exp;
  ulong local_8;
  
  local_8 = *in_RDI >> 0x34 & 0x7ff;
  iVar1 = flexfloat_bias(*(flexfloat_desc_t *)(in_RDI + 1));
  if ((local_8 != 0) && (local_8 != 0x7ff)) {
    local_8 = (local_8 - 0x3ff) + iVar1;
  }
  return local_8;
}

Assistant:

int_fast16_t flexfloat_exp(const flexfloat_t *a)
{
    int_fast16_t a_exp   = EXPONENT(CAST_TO_INT(a->value));

    int_fast16_t bias    = flexfloat_bias(a->desc);

    if(a_exp == 0 || a_exp == INF_EXP)
        return a_exp;
    else
        return (a_exp - BIAS) + bias;
}